

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int __thiscall AActor::CallDoSpecialDamage(AActor *this,AActor *target,int damage,FName *damagetype)

{
  PClass *pPVar1;
  PNativeStruct *pPVar2;
  int iVar3;
  DObject *p;
  PFunction *pPVar4;
  undefined4 extraout_var;
  VMFunction *func;
  FString *this_00;
  long lVar5;
  undefined8 *in_FS_OFFSET;
  int retval;
  VMReturn ret;
  VMValue params [4];
  int local_84;
  VMReturn local_80;
  int local_6c;
  anon_union_16_5_cf148060_for_VMValue_0 local_68;
  AActor *local_58;
  undefined4 local_50;
  undefined1 local_4c;
  int local_48;
  undefined1 local_3c;
  FString local_38;
  char local_2c [4];
  
  if (CallDoSpecialDamage::VIndex == 0xffffffff) {
    pPVar2 = &(RegistrationInfo.MyClass)->super_PNativeStruct;
    iVar3 = FName::NameManager::FindName(&FName::NameData,"DoSpecialDamage",false);
    local_68.i = iVar3;
    p = (DObject *)
        PSymbolTable::FindSymbol
                  (&(pPVar2->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.Symbols
                   ,(FName *)&local_68.field_1,false);
    pPVar4 = dyn_cast<PFunction>(p);
    if (pPVar4 == (PFunction *)0x0) {
      __assert_fail("sym != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/virtual.h"
                    ,5,"unsigned int GetVirtualIndex(PClass *, const char *)");
    }
    CallDoSpecialDamage::VIndex = ((pPVar4->Variants).Array)->Implementation->VirtualIndex;
    if (CallDoSpecialDamage::VIndex == 0xffffffff) {
      __assert_fail("VIndex != ~0u",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1ba8,"int AActor::CallDoSpecialDamage(AActor *, int, FName)");
    }
  }
  if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar3 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
    (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
  }
  pPVar1 = (this->super_DThinker).super_DObject.Class;
  if (CallDoSpecialDamage::VIndex < (pPVar1->Virtuals).Count) {
    func = (pPVar1->Virtuals).Array[CallDoSpecialDamage::VIndex];
  }
  else {
    func = (VMFunction *)0x0;
  }
  if (func == (VMFunction *)0x0) {
    local_6c = damagetype->Index;
    local_84 = (*(this->super_DThinker).super_DObject._vptr_DObject[0x10])
                         (this,target,(ulong)(uint)damage);
  }
  else {
    local_68.field_1.atag = 1;
    local_68.field_3.Type = '\x03';
    local_50 = 1;
    local_4c = 3;
    local_3c = 0;
    local_38.Chars._0_4_ = damagetype->Index;
    local_2c[0] = 0;
    local_80.Location = &local_84;
    local_80.TagOfs = 0;
    local_80.RegType = '\0';
    local_68.field_1.a = this;
    local_58 = target;
    local_48 = damage;
    GlobalVMStack::__tls_init();
    VMFrameStack::Call((VMFrameStack *)*in_FS_OFFSET,func,(VMValue *)&local_68.field_1,4,&local_80,1
                       ,(VMException **)0x0);
    lVar5 = -0x40;
    this_00 = &local_38;
    do {
      if (*(char *)((long)&this_00[1].Chars + 4) == '\x02') {
        FString::~FString(this_00);
      }
      this_00 = this_00 + -2;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0);
  }
  return local_84;
}

Assistant:

int AActor::CallDoSpecialDamage(AActor *target, int damage, FName damagetype)
{
	IFVIRTUAL(AActor, DoSpecialDamage)
	{
		// Without the type cast this picks the 'void *' assignment...
		VMValue params[4] = { (DObject*)this, (DObject*)target, damage, damagetype.GetIndex() };
		VMReturn ret;
		int retval;
		ret.IntAt(&retval);
		GlobalVMStack.Call(func, params, 4, &ret, 1, nullptr);
		return retval;
	}
	else return DoSpecialDamage(target, damage, damagetype);

}